

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O1

void __thiscall
cuckoocache_tests::EraseParallelTest::
test_cache_erase_parallel<CuckooCache::cache<uint256,SignatureCacheHasher>>
          (EraseParallelTest *this,size_t megabytes)

{
  uchar *puVar1;
  pointer puVar2;
  uchar *puVar3;
  uint256 e;
  uint256 e_00;
  pointer ptVar4;
  undefined8 uVar5;
  uint64_t uVar6;
  iterator pvVar7;
  iterator pvVar8;
  uint32_t x;
  int iVar9;
  long lVar10;
  ulong uVar11;
  iterator in_R8;
  iterator pvVar12;
  iterator in_R9;
  pointer puVar13;
  ulong uVar14;
  thread *t;
  pointer ptVar15;
  ulong uVar16;
  long lVar17;
  long in_FS_OFFSET;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  double hit_rate_fresh;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<uint256,_std::allocator<uint256>_> hashes_insert_copy;
  uint32_t n_insert;
  vector<uint256,_std::allocator<uint256>_> hashes;
  unique_lock<std::shared_mutex> l;
  shared_mutex mtx;
  cache<uint256,_SignatureCacheHasher> set;
  unique_lock<std::shared_mutex> l_1;
  char *pcVar38;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined8 local_258;
  undefined1 local_250 [32];
  bit_packed_atomic_flags local_230;
  _Bit_type *local_228;
  char *local_220;
  _Bit_type *local_218;
  double local_210;
  vector<std::thread,_std::allocator<std::thread>_> local_208;
  vector<uint256,_std::allocator<uint256>_> local_1e8;
  uint local_1cc;
  undefined1 local_1c8 [16];
  pointer local_1b8;
  undefined8 *local_1b0;
  assertion_result local_1a8;
  undefined8 **local_190;
  undefined1 local_188 [24];
  assertion_result local_170;
  unique_lock<std::shared_mutex> local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined8 local_118;
  cache<uint256,_SignatureCacheHasher> local_108;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_80 [8];
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  vector<uint256,_std::allocator<uint256>_> *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BasicTestingSetup,ZEROS);
  local_1c8 = (undefined1  [16])0x0;
  local_1b8 = (pointer)0x0;
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&local_108);
  uVar16 = megabytes << 0xf;
  uVar11 = uVar16 & 0x7ffffffffff8000;
  if (0xfffffffe < uVar11) {
    uVar11 = 0xffffffff;
  }
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup(&local_108,(uint32_t)uVar11);
  local_1cc = (uint)uVar16;
  std::vector<uint256,_std::allocator<uint256>_>::resize
            ((vector<uint256,_std::allocator<uint256>_> *)local_1c8,uVar16 & 0xffffffff);
  if (local_1cc != 0) {
    lVar17 = 0;
    uVar11 = 0;
    do {
      uVar5 = local_1c8._0_8_;
      lVar10 = 0;
      do {
        uVar6 = RandomMixin<FastRandomContext>::randbits<32>
                          (&(this->super_BasicTestingSetup).m_rng.
                            super_RandomMixin<FastRandomContext>);
        *(int *)((((base_blob<256U> *)uVar5)->m_data)._M_elems + lVar10 * 4 + lVar17) = (int)uVar6;
        lVar10 = lVar10 + 1;
      } while ((char)lVar10 != '\b');
      uVar11 = uVar11 + 1;
      lVar17 = lVar17 + 0x20;
    } while (uVar11 < local_1cc);
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector
            (&local_1e8,(vector<uint256,_std::allocator<uint256>_> *)local_1c8);
  local_128 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  local_118 = 0;
  local_78 = (mutex_type *)((ulong)local_78 & 0xffffffffffffff00);
  local_80 = (undefined1  [8])local_148;
  std::unique_lock<std::shared_mutex>::lock((unique_lock<std::shared_mutex> *)local_80);
  local_78 = (mutex_type *)CONCAT71(local_78._1_7_,true);
  if (1 < local_1cc) {
    lVar17 = 0;
    uVar11 = 0;
    do {
      puVar1 = ((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + lVar17;
      local_58 = *(undefined8 *)puVar1;
      uStack_50 = *(undefined8 *)(puVar1 + 8);
      puVar3 = ((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar17 + 0x10;
      local_48 = *(undefined8 *)puVar3;
      uStack_40 = *(undefined8 *)(puVar3 + 8);
      e.super_base_blob<256U>.m_data._M_elems[0x10] = (char)local_48;
      e.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)local_48 >> 8);
      e.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)local_48 >> 0x10);
      e.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)local_48 >> 0x18);
      e.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)local_48 >> 0x20);
      e.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)local_48 >> 0x28);
      e.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)local_48 >> 0x30);
      e.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)local_48 >> 0x38);
      e.super_base_blob<256U>.m_data._M_elems._0_16_ = *(undefined1 (*) [16])puVar1;
      e.super_base_blob<256U>.m_data._M_elems[0x18] = (char)uStack_40;
      e.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)uStack_40 >> 8);
      e.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((ulong)uStack_40 >> 0x10);
      e.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((ulong)uStack_40 >> 0x18);
      e.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)((ulong)uStack_40 >> 0x20);
      e.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((ulong)uStack_40 >> 0x28);
      e.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((ulong)uStack_40 >> 0x30);
      e.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((ulong)uStack_40 >> 0x38);
      CuckooCache::cache<uint256,_SignatureCacheHasher>::insert(&local_108,e);
      uVar11 = uVar11 + 1;
      lVar17 = lVar17 + 0x20;
    } while (uVar11 < local_1cc >> 1);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)local_80);
  local_208.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar9 = 0;
  do {
    local_80._0_4_ = iVar9;
    local_78 = (mutex_type *)local_148;
    local_70 = (undefined1 *)&local_1cc;
    local_68 = &local_108;
    local_60 = (vector<uint256,_std::allocator<uint256>_> *)local_1c8;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<cuckoocache_tests::EraseParallelTest::test_cache_erase_parallel<CuckooCache::cache<uint256,SignatureCacheHasher>>(unsigned_long)::_lambda()_1_>
              ((vector<std::thread,std::allocator<std::thread>> *)&local_208,
               (anon_class_40_5_413ab67b_for__M_head_impl *)local_80);
    iVar9 = iVar9 + 1;
  } while (iVar9 != 3);
  ptVar4 = local_208.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar15 = local_208.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start; ptVar15 != ptVar4; ptVar15 = ptVar15 + 1) {
    std::thread::join();
  }
  local_158._M_owns = false;
  local_158._M_device = (mutex_type *)local_148;
  std::unique_lock<std::shared_mutex>::lock(&local_158);
  local_158._M_owns = true;
  pvVar12 = (iterator)(ulong)local_1cc;
  if (pvVar12 != (iterator)0x0) {
    uVar11 = (ulong)(local_1cc >> 1);
    lVar17 = uVar11 << 5;
    do {
      puVar1 = ((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + lVar17;
      local_a8 = *(undefined8 *)puVar1;
      uStack_a0 = *(undefined8 *)(puVar1 + 8);
      puVar3 = ((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar17 + 0x10;
      local_98 = *(undefined8 *)puVar3;
      uStack_90 = *(undefined8 *)(puVar3 + 8);
      e_00.super_base_blob<256U>.m_data._M_elems[0x10] = (char)local_98;
      e_00.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)local_98 >> 8);
      e_00.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)local_98 >> 0x10);
      e_00.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)local_98 >> 0x18);
      e_00.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)local_98 >> 0x20);
      e_00.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)local_98 >> 0x28);
      e_00.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)local_98 >> 0x30);
      e_00.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)local_98 >> 0x38);
      e_00.super_base_blob<256U>.m_data._M_elems._0_16_ = *(undefined1 (*) [16])puVar1;
      e_00.super_base_blob<256U>.m_data._M_elems[0x18] = (char)uStack_90;
      e_00.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)uStack_90 >> 8);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((ulong)uStack_90 >> 0x10);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((ulong)uStack_90 >> 0x18);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)((ulong)uStack_90 >> 0x20);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((ulong)uStack_90 >> 0x28);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((ulong)uStack_90 >> 0x30);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((ulong)uStack_90 >> 0x38);
      CuckooCache::cache<uint256,_SignatureCacheHasher>::insert(&local_108,e_00);
      uVar11 = uVar11 + 1;
      lVar17 = lVar17 + 0x20;
    } while (uVar11 < local_1cc);
    pvVar12 = (iterator)(ulong)local_1cc;
  }
  pvVar7 = (iterator)((ulong)pvVar12 >> 2);
  dVar36 = 0.0;
  dVar37 = 0.0;
  dVar34 = 0.0;
  dVar35 = 0.0;
  if (3 < (uint)pvVar12) {
    uVar11 = (ulong)local_108.size;
    in_R8 = (iterator)0x0;
    in_R9 = (iterator)0x0;
    do {
      uVar16 = *(uint *)(((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->super_base_blob<256U>).m_data.
                        _M_elems * uVar11;
      uVar14 = uVar16 >> 0x20;
      local_80._4_4_ =
           (int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->super_base_blob<256U>).
                           m_data._M_elems + 4) * uVar11 >> 0x20);
      local_80._0_4_ = (int)(uVar16 >> 0x20);
      local_78 = (mutex_type *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0xc) * uVar11 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 8) * uVar11 >>
                               0x20));
      local_70 = (undefined1 *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x14) * uVar11 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x10) * uVar11 >>
                               0x20));
      local_68 = (cache<uint256,_SignatureCacheHasher> *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar11 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x18) * uVar11 >>
                               0x20));
      puVar13 = local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start + uVar14;
      puVar1 = local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14].super_base_blob<256U>.m_data._M_elems + 0x10
      ;
      puVar2 = (pointer)(local_1c8._0_8_ + in_R8 * 0x20);
      auVar28[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[0]);
      auVar28[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[1]);
      auVar28[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[2]);
      auVar28[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[3]);
      auVar28[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[4]);
      auVar28[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[5]);
      auVar28[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[6]);
      auVar28[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[7]);
      auVar28[8] = -((puVar2->super_base_blob<256U>).m_data._M_elems[8] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[8]);
      auVar28[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[9]);
      auVar28[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] ==
                     (puVar13->super_base_blob<256U>).m_data._M_elems[10]);
      auVar28[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar28[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar28[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar28[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar28[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xf]);
      puVar3 = (((pointer)(local_1c8._0_8_ + in_R8 * 0x20))->super_base_blob<256U>).m_data._M_elems
               + 0x10;
      auVar18[0] = -(*puVar3 == *puVar1);
      auVar18[1] = -(puVar3[1] == puVar1[1]);
      auVar18[2] = -(puVar3[2] == puVar1[2]);
      auVar18[3] = -(puVar3[3] == puVar1[3]);
      auVar18[4] = -(puVar3[4] == puVar1[4]);
      auVar18[5] = -(puVar3[5] == puVar1[5]);
      auVar18[6] = -(puVar3[6] == puVar1[6]);
      auVar18[7] = -(puVar3[7] == puVar1[7]);
      auVar18[8] = -(puVar3[8] == puVar1[8]);
      auVar18[9] = -(puVar3[9] == puVar1[9]);
      auVar18[10] = -(puVar3[10] == puVar1[10]);
      auVar18[0xb] = -(puVar3[0xb] == puVar1[0xb]);
      auVar18[0xc] = -(puVar3[0xc] == puVar1[0xc]);
      auVar18[0xd] = -(puVar3[0xd] == puVar1[0xd]);
      auVar18[0xe] = -(puVar3[0xe] == puVar1[0xe]);
      auVar18[0xf] = -(puVar3[0xf] == puVar1[0xf]);
      auVar18 = auVar18 & auVar28;
      if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) {
        uVar16 = 1;
      }
      else {
        puVar13 = (pointer)(local_1c8._0_8_ + in_R8 * 0x20);
        lVar17 = 4;
        do {
          lVar10 = lVar17;
          if (lVar10 == 0x20) break;
          puVar2 = local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start + *(uint *)(local_80 + lVar10);
          puVar1 = local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start[*(uint *)(local_80 + lVar10)].
                   super_base_blob<256U>.m_data._M_elems + 0x10;
          auVar29[0] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0]);
          auVar29[1] = -((puVar13->super_base_blob<256U>).m_data._M_elems[1] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[1]);
          auVar29[2] = -((puVar13->super_base_blob<256U>).m_data._M_elems[2] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[2]);
          auVar29[3] = -((puVar13->super_base_blob<256U>).m_data._M_elems[3] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[3]);
          auVar29[4] = -((puVar13->super_base_blob<256U>).m_data._M_elems[4] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[4]);
          auVar29[5] = -((puVar13->super_base_blob<256U>).m_data._M_elems[5] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[5]);
          auVar29[6] = -((puVar13->super_base_blob<256U>).m_data._M_elems[6] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[6]);
          auVar29[7] = -((puVar13->super_base_blob<256U>).m_data._M_elems[7] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[7]);
          auVar29[8] = -((puVar13->super_base_blob<256U>).m_data._M_elems[8] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[8]);
          auVar29[9] = -((puVar13->super_base_blob<256U>).m_data._M_elems[9] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[9]);
          auVar29[10] = -((puVar13->super_base_blob<256U>).m_data._M_elems[10] ==
                         (puVar2->super_base_blob<256U>).m_data._M_elems[10]);
          auVar29[0xb] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xb] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xb]);
          auVar29[0xc] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xc] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xc]);
          auVar29[0xd] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xd] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xd]);
          auVar29[0xe] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xe] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xe]);
          auVar29[0xf] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xf] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xf]);
          auVar19[0] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x10] == *puVar1);
          auVar19[1] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x11] == puVar1[1]);
          auVar19[2] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x12] == puVar1[2]);
          auVar19[3] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x13] == puVar1[3]);
          auVar19[4] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x14] == puVar1[4]);
          auVar19[5] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x15] == puVar1[5]);
          auVar19[6] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x16] == puVar1[6]);
          auVar19[7] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x17] == puVar1[7]);
          auVar19[8] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x18] == puVar1[8]);
          auVar19[9] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x19] == puVar1[9]);
          auVar19[10] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1a] == puVar1[10]);
          auVar19[0xb] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1b] == puVar1[0xb]);
          auVar19[0xc] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1c] == puVar1[0xc]);
          auVar19[0xd] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1d] == puVar1[0xd]);
          auVar19[0xe] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1e] == puVar1[0xe]);
          auVar19[0xf] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1f] == puVar1[0xf]);
          auVar19 = auVar19 & auVar29;
          lVar17 = lVar10 + 4;
        } while ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff);
        uVar16 = (ulong)(lVar10 != 0x20);
      }
      in_R9 = in_R9 + uVar16;
      in_R8 = in_R8 + 1;
    } while (in_R8 != pvVar7);
    auVar20._8_4_ = (int)((ulong)in_R9 >> 0x20);
    auVar20._0_8_ = in_R9;
    auVar20._12_4_ = 0x45300000;
    dVar35 = auVar20._8_8_ - 1.9342813113834067e+25;
    dVar34 = dVar35 + ((double)CONCAT44(0x43300000,(int)in_R9) - 4503599627370496.0);
  }
  pvVar8 = (iterator)((ulong)pvVar12 >> 1);
  if ((uint)pvVar7 < (uint)pvVar8) {
    uVar11 = (ulong)local_108.size;
    in_R9 = (iterator)0x0;
    do {
      uVar16 = *(uint *)(((pointer)(local_1c8._0_8_ + pvVar7 * 0x20))->super_base_blob<256U>).m_data
                        ._M_elems * uVar11;
      uVar14 = uVar16 >> 0x20;
      local_80._4_4_ =
           (int)(*(uint *)((((pointer)(local_1c8._0_8_ + pvVar7 * 0x20))->super_base_blob<256U>).
                           m_data._M_elems + 4) * uVar11 >> 0x20);
      local_80._0_4_ = (int)(uVar16 >> 0x20);
      local_78 = (mutex_type *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + pvVar7 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0xc) * uVar11 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + pvVar7 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 8) * uVar11 >>
                               0x20));
      local_70 = (undefined1 *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + pvVar7 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x14) * uVar11 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + pvVar7 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x10) * uVar11 >>
                               0x20));
      local_68 = (cache<uint256,_SignatureCacheHasher> *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + pvVar7 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar11 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + pvVar7 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x18) * uVar11 >>
                               0x20));
      puVar13 = local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start + uVar14;
      puVar1 = local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14].super_base_blob<256U>.m_data._M_elems + 0x10
      ;
      puVar2 = (pointer)(local_1c8._0_8_ + pvVar7 * 0x20);
      auVar30[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[0]);
      auVar30[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[1]);
      auVar30[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[2]);
      auVar30[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[3]);
      auVar30[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[4]);
      auVar30[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[5]);
      auVar30[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[6]);
      auVar30[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[7]);
      auVar30[8] = -((puVar2->super_base_blob<256U>).m_data._M_elems[8] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[8]);
      auVar30[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[9]);
      auVar30[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] ==
                     (puVar13->super_base_blob<256U>).m_data._M_elems[10]);
      auVar30[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar30[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar30[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar30[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar30[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xf]);
      puVar3 = (((pointer)(local_1c8._0_8_ + pvVar7 * 0x20))->super_base_blob<256U>).m_data._M_elems
               + 0x10;
      auVar21[0] = -(*puVar3 == *puVar1);
      auVar21[1] = -(puVar3[1] == puVar1[1]);
      auVar21[2] = -(puVar3[2] == puVar1[2]);
      auVar21[3] = -(puVar3[3] == puVar1[3]);
      auVar21[4] = -(puVar3[4] == puVar1[4]);
      auVar21[5] = -(puVar3[5] == puVar1[5]);
      auVar21[6] = -(puVar3[6] == puVar1[6]);
      auVar21[7] = -(puVar3[7] == puVar1[7]);
      auVar21[8] = -(puVar3[8] == puVar1[8]);
      auVar21[9] = -(puVar3[9] == puVar1[9]);
      auVar21[10] = -(puVar3[10] == puVar1[10]);
      auVar21[0xb] = -(puVar3[0xb] == puVar1[0xb]);
      auVar21[0xc] = -(puVar3[0xc] == puVar1[0xc]);
      auVar21[0xd] = -(puVar3[0xd] == puVar1[0xd]);
      auVar21[0xe] = -(puVar3[0xe] == puVar1[0xe]);
      auVar21[0xf] = -(puVar3[0xf] == puVar1[0xf]);
      auVar21 = auVar21 & auVar30;
      if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
        uVar16 = 1;
      }
      else {
        puVar13 = (pointer)(local_1c8._0_8_ + pvVar7 * 0x20);
        lVar17 = 4;
        do {
          lVar10 = lVar17;
          if (lVar10 == 0x20) break;
          puVar2 = local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start + *(uint *)(local_80 + lVar10);
          puVar1 = local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start[*(uint *)(local_80 + lVar10)].
                   super_base_blob<256U>.m_data._M_elems + 0x10;
          auVar31[0] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0]);
          auVar31[1] = -((puVar13->super_base_blob<256U>).m_data._M_elems[1] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[1]);
          auVar31[2] = -((puVar13->super_base_blob<256U>).m_data._M_elems[2] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[2]);
          auVar31[3] = -((puVar13->super_base_blob<256U>).m_data._M_elems[3] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[3]);
          auVar31[4] = -((puVar13->super_base_blob<256U>).m_data._M_elems[4] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[4]);
          auVar31[5] = -((puVar13->super_base_blob<256U>).m_data._M_elems[5] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[5]);
          auVar31[6] = -((puVar13->super_base_blob<256U>).m_data._M_elems[6] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[6]);
          auVar31[7] = -((puVar13->super_base_blob<256U>).m_data._M_elems[7] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[7]);
          auVar31[8] = -((puVar13->super_base_blob<256U>).m_data._M_elems[8] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[8]);
          auVar31[9] = -((puVar13->super_base_blob<256U>).m_data._M_elems[9] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[9]);
          auVar31[10] = -((puVar13->super_base_blob<256U>).m_data._M_elems[10] ==
                         (puVar2->super_base_blob<256U>).m_data._M_elems[10]);
          auVar31[0xb] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xb] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xb]);
          auVar31[0xc] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xc] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xc]);
          auVar31[0xd] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xd] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xd]);
          auVar31[0xe] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xe] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xe]);
          auVar31[0xf] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xf] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xf]);
          auVar22[0] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x10] == *puVar1);
          auVar22[1] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x11] == puVar1[1]);
          auVar22[2] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x12] == puVar1[2]);
          auVar22[3] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x13] == puVar1[3]);
          auVar22[4] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x14] == puVar1[4]);
          auVar22[5] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x15] == puVar1[5]);
          auVar22[6] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x16] == puVar1[6]);
          auVar22[7] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x17] == puVar1[7]);
          auVar22[8] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x18] == puVar1[8]);
          auVar22[9] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x19] == puVar1[9]);
          auVar22[10] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1a] == puVar1[10]);
          auVar22[0xb] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1b] == puVar1[0xb]);
          auVar22[0xc] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1c] == puVar1[0xc]);
          auVar22[0xd] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1d] == puVar1[0xd]);
          auVar22[0xe] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1e] == puVar1[0xe]);
          auVar22[0xf] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1f] == puVar1[0xf]);
          auVar22 = auVar22 & auVar31;
          lVar17 = lVar10 + 4;
        } while ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) != 0xffff);
        uVar16 = (ulong)(lVar10 != 0x20);
      }
      in_R9 = in_R9 + uVar16;
      pvVar7 = pvVar7 + 1;
    } while (pvVar7 != pvVar8);
    auVar23._8_4_ = (int)((ulong)in_R9 >> 0x20);
    auVar23._0_8_ = in_R9;
    auVar23._12_4_ = 0x45300000;
    dVar37 = auVar23._8_8_ - 1.9342813113834067e+25;
    dVar36 = dVar37 + ((double)CONCAT44(0x43300000,(int)in_R9) - 4503599627370496.0);
    in_R8 = pvVar8;
  }
  if ((uint)pvVar12 == 0) {
    local_210 = 0.0;
  }
  else {
    uVar11 = (ulong)local_108.size;
    in_R8 = (iterator)0x0;
    do {
      uVar16 = *(uint *)(((pointer)(local_1c8._0_8_ + pvVar8 * 0x20))->super_base_blob<256U>).m_data
                        ._M_elems * uVar11;
      uVar14 = uVar16 >> 0x20;
      local_80._4_4_ =
           (int)(*(uint *)((((pointer)(local_1c8._0_8_ + pvVar8 * 0x20))->super_base_blob<256U>).
                           m_data._M_elems + 4) * uVar11 >> 0x20);
      local_80._0_4_ = (int)(uVar16 >> 0x20);
      local_78 = (mutex_type *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + pvVar8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0xc) * uVar11 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + pvVar8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 8) * uVar11 >>
                               0x20));
      local_70 = (undefined1 *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + pvVar8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x14) * uVar11 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + pvVar8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x10) * uVar11 >>
                               0x20));
      local_68 = (cache<uint256,_SignatureCacheHasher> *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_1c8._0_8_ + pvVar8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar11 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_1c8._0_8_ + pvVar8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x18) * uVar11 >>
                               0x20));
      puVar13 = local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start + uVar14;
      puVar1 = local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14].super_base_blob<256U>.m_data._M_elems + 0x10
      ;
      puVar2 = (pointer)(local_1c8._0_8_ + pvVar8 * 0x20);
      auVar32[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[0]);
      auVar32[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[1]);
      auVar32[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[2]);
      auVar32[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[3]);
      auVar32[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[4]);
      auVar32[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[5]);
      auVar32[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[6]);
      auVar32[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[7]);
      auVar32[8] = -((puVar2->super_base_blob<256U>).m_data._M_elems[8] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[8]);
      auVar32[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] ==
                    (puVar13->super_base_blob<256U>).m_data._M_elems[9]);
      auVar32[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] ==
                     (puVar13->super_base_blob<256U>).m_data._M_elems[10]);
      auVar32[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar32[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar32[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar32[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar32[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      (puVar13->super_base_blob<256U>).m_data._M_elems[0xf]);
      puVar3 = (((pointer)(local_1c8._0_8_ + pvVar8 * 0x20))->super_base_blob<256U>).m_data._M_elems
               + 0x10;
      auVar24[0] = -(*puVar3 == *puVar1);
      auVar24[1] = -(puVar3[1] == puVar1[1]);
      auVar24[2] = -(puVar3[2] == puVar1[2]);
      auVar24[3] = -(puVar3[3] == puVar1[3]);
      auVar24[4] = -(puVar3[4] == puVar1[4]);
      auVar24[5] = -(puVar3[5] == puVar1[5]);
      auVar24[6] = -(puVar3[6] == puVar1[6]);
      auVar24[7] = -(puVar3[7] == puVar1[7]);
      auVar24[8] = -(puVar3[8] == puVar1[8]);
      auVar24[9] = -(puVar3[9] == puVar1[9]);
      auVar24[10] = -(puVar3[10] == puVar1[10]);
      auVar24[0xb] = -(puVar3[0xb] == puVar1[0xb]);
      auVar24[0xc] = -(puVar3[0xc] == puVar1[0xc]);
      auVar24[0xd] = -(puVar3[0xd] == puVar1[0xd]);
      auVar24[0xe] = -(puVar3[0xe] == puVar1[0xe]);
      auVar24[0xf] = -(puVar3[0xf] == puVar1[0xf]);
      auVar24 = auVar24 & auVar32;
      if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
        in_R9 = (iterator)0x1;
      }
      else {
        puVar13 = (pointer)(local_1c8._0_8_ + pvVar8 * 0x20);
        lVar17 = 4;
        do {
          lVar10 = lVar17;
          if (lVar10 == 0x20) break;
          puVar2 = local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start + *(uint *)(local_80 + lVar10);
          puVar1 = local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start[*(uint *)(local_80 + lVar10)].
                   super_base_blob<256U>.m_data._M_elems + 0x10;
          auVar33[0] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0]);
          auVar33[1] = -((puVar13->super_base_blob<256U>).m_data._M_elems[1] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[1]);
          auVar33[2] = -((puVar13->super_base_blob<256U>).m_data._M_elems[2] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[2]);
          auVar33[3] = -((puVar13->super_base_blob<256U>).m_data._M_elems[3] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[3]);
          auVar33[4] = -((puVar13->super_base_blob<256U>).m_data._M_elems[4] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[4]);
          auVar33[5] = -((puVar13->super_base_blob<256U>).m_data._M_elems[5] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[5]);
          auVar33[6] = -((puVar13->super_base_blob<256U>).m_data._M_elems[6] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[6]);
          auVar33[7] = -((puVar13->super_base_blob<256U>).m_data._M_elems[7] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[7]);
          auVar33[8] = -((puVar13->super_base_blob<256U>).m_data._M_elems[8] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[8]);
          auVar33[9] = -((puVar13->super_base_blob<256U>).m_data._M_elems[9] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[9]);
          auVar33[10] = -((puVar13->super_base_blob<256U>).m_data._M_elems[10] ==
                         (puVar2->super_base_blob<256U>).m_data._M_elems[10]);
          auVar33[0xb] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xb] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xb]);
          auVar33[0xc] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xc] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xc]);
          auVar33[0xd] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xd] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xd]);
          auVar33[0xe] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xe] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xe]);
          auVar33[0xf] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0xf] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xf]);
          auVar25[0] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x10] == *puVar1);
          auVar25[1] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x11] == puVar1[1]);
          auVar25[2] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x12] == puVar1[2]);
          auVar25[3] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x13] == puVar1[3]);
          auVar25[4] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x14] == puVar1[4]);
          auVar25[5] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x15] == puVar1[5]);
          auVar25[6] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x16] == puVar1[6]);
          auVar25[7] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x17] == puVar1[7]);
          auVar25[8] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x18] == puVar1[8]);
          auVar25[9] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x19] == puVar1[9]);
          auVar25[10] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1a] == puVar1[10]);
          auVar25[0xb] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1b] == puVar1[0xb]);
          auVar25[0xc] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1c] == puVar1[0xc]);
          auVar25[0xd] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1d] == puVar1[0xd]);
          auVar25[0xe] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1e] == puVar1[0xe]);
          auVar25[0xf] = -((puVar13->super_base_blob<256U>).m_data._M_elems[0x1f] == puVar1[0xf]);
          auVar25 = auVar25 & auVar33;
          lVar17 = lVar10 + 4;
        } while ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) != 0xffff);
        in_R9 = (iterator)(ulong)(lVar10 != 0x20);
      }
      in_R8 = in_R8 + (long)in_R9;
      pvVar8 = pvVar8 + 1;
    } while (pvVar8 < pvVar12);
    auVar26._8_4_ = (int)((ulong)in_R8 >> 0x20);
    auVar26._0_8_ = in_R8;
    auVar26._12_4_ = 0x45300000;
    local_210 = (auVar26._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)in_R8) - 4503599627370496.0);
  }
  dVar27 = (double)(long)pvVar12;
  local_210 = local_210 / (dVar27 * 0.5);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_218 = (_Bit_type *)0xeaa89d;
  local_230.mem._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl =
       (unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
       )&boost::unit_test::basic_cstring<char_const>::null;
  local_228 = (_Bit_type *)&boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x10f;
  file.m_begin = local_250 + 0x30;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)(local_250 + 0x20),
             msg);
  local_250._8_8_ = local_250._8_8_ & 0xffffffffffffff00;
  local_250._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_250._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_250._24_8_ = "";
  local_1b0 = &local_258;
  local_258 = 0x3ff0000000000000;
  local_188._0_8_ = &local_210;
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 1.0);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_188._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_188._16_8_ = "";
  local_68 = (cache<uint256,_SignatureCacheHasher> *)local_188;
  local_78 = (mutex_type *)((ulong)local_78 & 0xffffffffffffff00);
  local_80 = (undefined1  [8])&PTR__lazy_ostream_013d5600;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_190 = &local_1b0;
  local_1a8.m_message.px = (element_type *)((ulong)local_1a8.m_message.px & 0xffffffffffffff00);
  local_1a8._0_8_ = &PTR__lazy_ostream_013d5600;
  local_1a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcVar38 = "hit_rate_fresh";
  pvVar12 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,(lazy_ostream *)local_250,1,2,REQUIRE,0xeaa9aa,(size_t)(local_188 + 8),0x10f
             ,local_80,"1.0",&local_1a8,dVar27,dVar36,dVar37,dVar34,dVar35);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x112;
  file_00.m_begin = (iterator)&local_268;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_278,
             msg_00);
  dVar34 = dVar34 / (dVar27 * 0.25);
  local_1a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(dVar34 + dVar34 < dVar36 / (dVar27 * 0.25));
  local_1a8.m_message.px = (element_type *)0x0;
  local_1a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_250._0_8_ = "hit_rate_stale > 2 * hit_rate_erased_but_contained";
  local_250._8_8_ = "";
  local_78 = (mutex_type *)((ulong)local_78 & 0xffffffffffffff00);
  local_80 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_280 = "";
  local_68 = (cache<uint256,_SignatureCacheHasher> *)local_250;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a8,(lazy_ostream *)local_80,1,0,WARN,(check_type)pcVar38,(size_t)&local_288,
             0x112);
  boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_158);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_208);
  if (local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_108.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_108.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_108.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_108.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_108.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_108.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_108.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_108.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_108.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_108.collection_flags.mem._M_t.
      super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
      .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl !=
      (__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
       )0x0) {
    operator_delete__((void *)local_108.collection_flags.mem._M_t.
                              super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                              .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>.
                              _M_head_impl);
  }
  local_108.collection_flags.mem._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl =
       (unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
       )(__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
         )0x0;
  if (local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,(long)local_1b8 - local_1c8._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void test_cache_erase_parallel(size_t megabytes)
{
    double load = 1;
    SeedRandomForTest(SeedRand::ZEROS);
    std::vector<uint256> hashes;
    Cache set{};
    size_t bytes = megabytes * (1 << 20);
    set.setup_bytes(bytes);
    uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));
    hashes.resize(n_insert);
    for (uint32_t i = 0; i < n_insert; ++i) {
        uint32_t* ptr = (uint32_t*)hashes[i].begin();
        for (uint8_t j = 0; j < 8; ++j)
            *(ptr++) = m_rng.rand32();
    }
    /** We make a copy of the hashes because future optimizations of the
     * cuckoocache may overwrite the inserted element, so the test is
     * "future proofed".
     */
    std::vector<uint256> hashes_insert_copy = hashes;
    std::shared_mutex mtx;

    {
        /** Grab lock to make sure we release inserts */
        std::unique_lock<std::shared_mutex> l(mtx);
        /** Insert the first half */
        for (uint32_t i = 0; i < (n_insert / 2); ++i)
            set.insert(hashes_insert_copy[i]);
    }

    /** Spin up 3 threads to run contains with erase.
     */
    std::vector<std::thread> threads;
    /** Erase the first quarter */
    for (uint32_t x = 0; x < 3; ++x)
        /** Each thread is emplaced with x copy-by-value
        */
        threads.emplace_back([&, x] {
            std::shared_lock<std::shared_mutex> l(mtx);
            size_t ntodo = (n_insert/4)/3;
            size_t start = ntodo*x;
            size_t end = ntodo*(x+1);
            for (uint32_t i = start; i < end; ++i) {
                bool contains = set.contains(hashes[i], true);
                assert(contains);
            }
        });

    /** Wait for all threads to finish
     */
    for (std::thread& t : threads)
        t.join();
    /** Grab lock to make sure we observe erases */
    std::unique_lock<std::shared_mutex> l(mtx);
    /** Insert the second half */
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        set.insert(hashes_insert_copy[i]);

    /** elements that we marked erased but that are still there */
    size_t count_erased_but_contained = 0;
    /** elements that we did not erase but are older */
    size_t count_stale = 0;
    /** elements that were most recently inserted */
    size_t count_fresh = 0;

    for (uint32_t i = 0; i < (n_insert / 4); ++i)
        count_erased_but_contained += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 4); i < (n_insert / 2); ++i)
        count_stale += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        count_fresh += set.contains(hashes[i], false);

    double hit_rate_erased_but_contained = double(count_erased_but_contained) / (double(n_insert) / 4.0);
    double hit_rate_stale = double(count_stale) / (double(n_insert) / 4.0);
    double hit_rate_fresh = double(count_fresh) / (double(n_insert) / 2.0);

    // Check that our hit_rate_fresh is perfect
    BOOST_CHECK_EQUAL(hit_rate_fresh, 1.0);
    // Check that we have a more than 2x better hit rate on stale elements than
    // erased elements.
    BOOST_CHECK(hit_rate_stale > 2 * hit_rate_erased_but_contained);
}